

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O3

void installDirs(xmlNodePtr tst,xmlChar *base)

{
  xmlChar *path;
  xmlChar *base_00;
  xmlNodePtr pxVar1;
  
  path = getString(tst,"string(@name)");
  if (path != (xmlChar *)0x0) {
    base_00 = composeDir(base,path);
    (*_xmlFree)(path);
    if (base_00 != (xmlChar *)0x0) {
      pxVar1 = getNext(tst,"./resource[1]");
      if (pxVar1 != (xmlNodePtr)0x0) {
        installResources(pxVar1,base_00);
      }
      for (pxVar1 = getNext(tst,"./dir[1]"); pxVar1 != (xmlNodePtr)0x0;
          pxVar1 = getNext(pxVar1,"following-sibling::dir[1]")) {
        installDirs(pxVar1,base_00);
      }
      (*_xmlFree)(base_00);
      return;
    }
  }
  return;
}

Assistant:

static void
installDirs(xmlNodePtr tst, const xmlChar *base) {
    xmlNodePtr test;
    xmlChar *name, *res;

    name = getString(tst, "string(@name)");
    if (name == NULL)
        return;
    res = composeDir(base, name);
    xmlFree(name);
    if (res == NULL) {
	return;
    }
    /* Now process resources and subdir recursively */
    test = getNext(tst, "./resource[1]");
    if (test != NULL) {
        installResources(test, res);
    }
    test = getNext(tst, "./dir[1]");
    while (test != NULL) {
        installDirs(test, res);
	test = getNext(test, "following-sibling::dir[1]");
    }
    xmlFree(res);
}